

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void standard_image_validate(standard_display *dp,png_const_structp pp,int iImage,int iDisplay)

{
  undefined1 *puVar1;
  undefined8 buffer;
  byte bVar2;
  uint uVar3;
  int iVar4;
  png_bytep ppVar5;
  byte bVar6;
  ulong uVar7;
  char *__format;
  long lVar8;
  uint uVar9;
  uint y;
  long lVar10;
  char msg [64];
  png_byte std [1024];
  char local_478 [63];
  byte abStack_439 [1033];
  
  store_image_check(dp->ps,pp,0);
  if (-1 < iImage) {
    store_image_check(dp->ps,pp,iImage);
  }
  lVar10 = 0;
  buffer = (long)abStack_439 + 1;
  while( true ) {
    y = (uint)lVar10;
    if (dp->h <= y) {
      puVar1 = &dp->ps->field_0x18;
      *puVar1 = *puVar1 | 0x80;
      return;
    }
    memset((void *)buffer,0xb2,0x400);
    bVar2 = (byte)dp->id;
    bVar6 = bVar2 & 7;
    bVar2 = bVar2 >> 3;
    uVar9 = dp->id >> 0x10 & 0xff;
    if (uVar9 == 0) {
      transform_row(pp,(png_byte *)buffer,bVar6,bVar2,y);
    }
    else {
      uVar3 = bit_size(pp,bVar6,bVar2);
      size_row((png_byte *)buffer,uVar9 * uVar3,y);
    }
    ppVar5 = store_image_row(dp->ps,pp,0,y);
    iVar4 = pixel_cmp((png_const_bytep)buffer,ppVar5,dp->bit_width);
    if (iVar4 != 0) break;
    if (-1 < iImage) {
      ppVar5 = store_image_row(dp->ps,pp,iImage,y);
      iVar4 = pixel_cmp((png_const_bytep)buffer,ppVar5,dp->bit_width);
      if (iVar4 != 0) {
        lVar8 = (long)iVar4;
        uVar7 = lVar8 - 1;
        bVar2 = abStack_439[lVar8];
        ppVar5 = store_image_row(dp->ps,pp,iImage,y);
        bVar6 = ppVar5[lVar8 + -1];
        __format = "display row[%lu][%d] changed from %.2x to %.2x";
        goto LAB_0010fe62;
      }
    }
    lVar10 = lVar10 + 1;
  }
  lVar8 = (long)iVar4;
  bVar2 = abStack_439[lVar8];
  ppVar5 = store_image_row(dp->ps,pp,0,y);
  bVar6 = ppVar5[lVar8 + -1];
  __format = "PNG image row[%lu][%d] changed from %.2x to %.2x";
  uVar7 = lVar8 - 1U & 0xffffffff;
LAB_0010fe62:
  sprintf(local_478,__format,lVar10,uVar7,(ulong)bVar2,(ulong)bVar6);
  png_error(pp,local_478);
}

Assistant:

static void
standard_image_validate(standard_display *dp, png_const_structp pp, int iImage,
    int iDisplay)
{
   png_uint_32 y;

   if (iImage >= 0)
      store_image_check(dp->ps, pp, iImage);

   if (iDisplay >= 0)
      store_image_check(dp->ps, pp, iDisplay);

   for (y=0; y<dp->h; ++y)
      standard_row_validate(dp, pp, iImage, iDisplay, y);

   /* This avoids false positives if the validation code is never called! */
   dp->ps->validated = 1;
}